

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

aiVector3D
CalculateVertexNormal
          (SIBMesh *mesh,uint32_t faceIdx,uint32_t pos,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *faceNormals)

{
  uint uVar1;
  uint32_t posB_00;
  aiVector3D aVar2;
  uint32_t uVar3;
  const_reference o;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  reference pvVar4;
  SIBEdge *pSVar5;
  float f;
  float len;
  SIBEdge *edge;
  uint32_t posB;
  uint32_t n;
  uint32_t posA;
  uint32_t numPoints;
  uint32_t *idx;
  uint32_t local_48;
  uint32_t nextFaceIdx;
  uint32_t prevFaceIdx;
  uint32_t startFaceIdx;
  float local_38;
  int local_34;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvStack_30;
  int pass;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *faceNormals_local;
  uint32_t pos_local;
  uint32_t faceIdx_local;
  SIBMesh *mesh_local;
  float fStack_10;
  aiVector3D vtxNormal;
  
  pvStack_30 = faceNormals;
  faceNormals_local._0_4_ = pos;
  faceNormals_local._4_4_ = faceIdx;
  _pos_local = mesh;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&mesh_local + 4));
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&prevFaceIdx,0.0,0.0,0.0);
    uVar3 = faceNormals_local._4_4_;
    mesh_local._4_4_ = (float)prevFaceIdx;
    fStack_10 = (float)startFaceIdx;
    vtxNormal.x = local_38;
    local_48 = faceNormals_local._4_4_;
    while( true ) {
      o = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                    (pvStack_30,(ulong)faceNormals_local._4_4_);
      aiVector3t<float>::operator+=((aiVector3t<float> *)((long)&mesh_local + 4),o);
      idx._4_4_ = 0xffffffff;
      this = &_pos_local->idx;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&_pos_local->faceStart,(ulong)faceNormals_local._4_4_);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (this,(ulong)*pvVar4);
      _posA = pvVar4 + 1;
      uVar1 = *pvVar4;
      posB = _posA[(uVar1 - 1) * 3];
      for (edge._4_4_ = 0; edge._4_4_ < uVar1; edge._4_4_ = edge._4_4_ + 1) {
        posB_00 = *_posA;
        if ((((posB == (uint32_t)faceNormals_local) || (posB_00 == (uint32_t)faceNormals_local)) &&
            ((pSVar5 = GetEdge(_pos_local,posB,posB_00), pSVar5->faceA == faceNormals_local._4_4_ ||
             (pSVar5->faceB == faceNormals_local._4_4_)))) && ((pSVar5->creased & 1U) == 0)) {
          if (((pSVar5->faceA == local_48) || (pSVar5->faceA == faceNormals_local._4_4_)) ||
             (pSVar5->faceA == 0xffffffff)) {
            if (((pSVar5->faceB != local_48) && (pSVar5->faceB != faceNormals_local._4_4_)) &&
               (pSVar5->faceB != 0xffffffff)) {
              idx._4_4_ = pSVar5->faceB;
            }
          }
          else {
            idx._4_4_ = pSVar5->faceA;
          }
        }
        _posA = _posA + 3;
        posB = posB_00;
      }
      if ((idx._4_4_ == 0xffffffff) || (idx._4_4_ == uVar3)) break;
      local_48 = faceNormals_local._4_4_;
      faceNormals_local._4_4_ = idx._4_4_;
    }
  }
  f = aiVector3t<float>::Length((aiVector3t<float> *)((long)&mesh_local + 4));
  if (1e-09 < f) {
    aiVector3t<float>::operator/=((aiVector3t<float> *)((long)&mesh_local + 4),f);
  }
  aVar2.z = vtxNormal.x;
  aVar2.x = mesh_local._4_4_;
  aVar2.y = fStack_10;
  return aVar2;
}

Assistant:

static aiVector3D CalculateVertexNormal(SIBMesh* mesh, uint32_t faceIdx, uint32_t pos,
                                        const std::vector<aiVector3D>& faceNormals)
{
    // Creased edges complicate this. We need to find the start/end range of the
    // ring of faces that touch this position.
    // We do this in two passes. The first pass is to find the end of the range,
    // the second is to work backwards to the start and calculate the final normal.
    aiVector3D vtxNormal;
    for (int pass=0;pass<2;pass++)
    {
        vtxNormal = aiVector3D(0, 0, 0);
        uint32_t startFaceIdx = faceIdx;
        uint32_t prevFaceIdx = faceIdx;

        // Process each connected face.
        while (true)
        {
            // Accumulate the face normal.
            vtxNormal += faceNormals[faceIdx];

            uint32_t nextFaceIdx = 0xffffffff;

            // Move to the next edge sharing this position.
            uint32_t* idx = &mesh->idx[mesh->faceStart[faceIdx]];
            uint32_t numPoints = *idx++;
            uint32_t posA = idx[(numPoints-1)*N+POS];
            for (uint32_t n=0;n<numPoints;n++,idx+=N)
            {
                uint32_t posB = idx[POS];

                // Test if this edge shares our target position.
                if (posA == pos || posB == pos)
                {
                    SIBEdge& edge = GetEdge(mesh, posA, posB);

                    // Non-manifold meshes can produce faces which share
                    // positions but have no edge entry, so check it.
                    if (edge.faceA == faceIdx || edge.faceB == faceIdx)
                    {
                        // Move to whichever side we didn't just come from.
                        if (!edge.creased) {
                            if (edge.faceA != prevFaceIdx && edge.faceA != faceIdx && edge.faceA != 0xffffffff)
                                nextFaceIdx = edge.faceA;
                            else if (edge.faceB != prevFaceIdx && edge.faceB != faceIdx && edge.faceB != 0xffffffff)
                                nextFaceIdx = edge.faceB;
                        }
                    }
                }

                posA = posB;
            }

            // Stop once we hit either an creased/unconnected edge, or we
            // wrapped around and hit our start point.
            if (nextFaceIdx == 0xffffffff || nextFaceIdx == startFaceIdx)
                break;

            prevFaceIdx = faceIdx;
            faceIdx = nextFaceIdx;
        }
    }

    // Normalize it.
    float len = vtxNormal.Length();
    if (len > 0.000000001f)
        vtxNormal /= len;
    return vtxNormal;
}